

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

void print_bits(uint8_t bits,char **str_array)

{
  byte bVar1;
  ulong uVar2;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,bits) != 0) {
    uVar2 = CONCAT71(in_register_00000039,bits) & 0xffffffff;
    do {
      bVar1 = (byte)uVar2;
      if ((uVar2 & 1) != 0) {
        printf("%s | ",*str_array);
      }
      str_array = str_array + 1;
      uVar2 = (ulong)((uint)(uVar2 >> 1) & 0x7f);
    } while (1 < bVar1);
  }
  return;
}

Assistant:

void print_bits(uint8_t bits, char *str_array[]) {
    int i = 0;

    while (bits) {
        if (bits & 1) {
            printf("%s | ", str_array[i]);
        }
        bits >>= 1;
        i++;
    }
}